

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O0

void __thiscall cppnet::Dispatcher::Listen(Dispatcher *this,uint64_t sock,string *ip,uint16_t port)

{
  bool bVar1;
  Task local_a0;
  native_handle_type local_70;
  native_handle_type local_68;
  undefined1 local_60 [8];
  anon_class_56_4_e8c7a8e2 task;
  uint16_t port_local;
  string *ip_local;
  uint64_t sock_local;
  Dispatcher *this_local;
  
  local_60 = (undefined1  [8])sock;
  task.this._6_2_ = port;
  std::__cxx11::string::string((string *)&task,(string *)ip);
  task._32_2_ = task.this._6_2_;
  task._40_8_ = this;
  local_68 = (native_handle_type)std::this_thread::get_id();
  local_70 = (this->_local_thread_id)._M_thread;
  bVar1 = std::operator==((id)local_68,(id)local_70);
  if (bVar1) {
    Listen::anon_class_56_4_e8c7a8e2::operator()((anon_class_56_4_e8c7a8e2 *)local_60);
  }
  else {
    std::function<void()>::
    function<cppnet::Dispatcher::Listen(unsigned_long,std::__cxx11::string_const&,unsigned_short)::__0&,void>
              ((function<void()> *)&local_a0,(anon_class_56_4_e8c7a8e2 *)local_60);
    PostTask(this,&local_a0);
    std::function<void_()>::~function(&local_a0);
  }
  Listen(unsigned_long,std::__cxx11::string_const&,unsigned_short)::$_0::~__0((__0 *)local_60);
  return;
}

Assistant:

void Dispatcher::Listen(uint64_t sock, const std::string& ip, uint16_t port) {
    auto task = [sock, ip, port, this]() {
        auto connect_sock = MakeConnectSocket();
        connect_sock->SetEventActions(_event_actions);
        connect_sock->SetCppNetBase(_cppnet_base.lock());
        connect_sock->SetSocket(sock);
        connect_sock->SetDispatcher(shared_from_this());

        connect_sock->Bind(ip, port);
        connect_sock->Listen();
    };

    if (std::this_thread::get_id() == _local_thread_id) {
        task();

    } else {
        PostTask(task);
    }
}